

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O1

void __thiscall
CRegexStack::pop(CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
                re_state_id *final,re_group_register *regs,short *loop_vars,int *iter)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  
  pcVar4 = this->buf_;
  iVar1 = this->sp_;
  piVar2 = (int *)(pcVar4 + (long)iVar1 + 0x24);
  *start_ofs = *(int *)(pcVar4 + (long)iVar1 + 4);
  *str_ofs = *(int *)(pcVar4 + (long)iVar1 + 8);
  *curlen = (long)*(int *)(pcVar4 + (long)iVar1 + 0xc);
  *state = *(re_state_id *)(pcVar4 + (long)iVar1 + 0x10);
  *final = *(re_state_id *)(pcVar4 + (long)iVar1 + 0x14);
  *iter = *(int *)(pcVar4 + (long)iVar1 + 0x1c);
  pcVar4 = this->buf_;
  if (piVar2 < pcVar4 + this->used_) {
    do {
      lVar3 = (long)*piVar2;
      if (lVar3 < 10) {
        regs[lVar3] = *(re_group_register *)(piVar2 + 1);
      }
      else {
        loop_vars[lVar3 + -10] = (short)piVar2[1];
      }
      piVar2 = piVar2 + 3;
      pcVar4 = this->buf_;
    } while (piVar2 < pcVar4 + this->used_);
  }
  this->used_ = (long)this->sp_;
  this->sp_ = *(int *)(pcVar4 + (long)this->sp_ + 0x20);
  return;
}

Assistant:

void pop(int *start_ofs, int *str_ofs, size_t *curlen,
             re_state_id *state, re_state_id *final,
             re_group_register *regs, short *loop_vars, int *iter)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* restore the string offset and state ID */
        *start_ofs = fp->start_ofs;
        *str_ofs = fp->str_ofs;
        *curlen = fp->curlen;
        *state = fp->state;
        *final = fp->final;
        *iter = fp->iter;
        
        /* run through the saved registers/variables in the state */
        for (regex_stack_var *var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* sense the type */
            if (var->id < RE_GROUP_REG_CNT)
            {
                /* it's a group register */
                regs[var->id] = var->val.group;
            }
            else
            {
                /* it's a loop variable */
                loop_vars[var->id - RE_GROUP_REG_CNT] = var->val.loopvar;
            }
        }

        /* we're done with the stop stack frame, so discard it */
        discard();
    }